

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

uint int_pow(uint base,uint n)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 1;
  for (; n != 0; n = n >> 1) {
    uVar1 = base;
    if ((n & 1) == 0) {
      uVar1 = 1;
    }
    uVar2 = uVar2 * uVar1;
    base = base * base;
  }
  return uVar2;
}

Assistant:

unsigned int_pow( unsigned base, unsigned n )
{
    unsigned result = 1;
    unsigned power = base;
    while (n > 0) {
        if ( n & 0x1 )
            result *= power;
            
        n >>= 1;
        power = power * power;
    }
        
    return result; 
}